

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O3

int cfttree(int n,int j,int k,double *a,int nw,double *w)

{
  uint uVar1;
  uint uVar2;
  uint uVar4;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)n;
  if ((k & 3U) == 0) {
    do {
      uVar1 = (int)uVar3 * 4;
      uVar3 = (ulong)uVar1;
      uVar4 = k >> 2;
      uVar2 = k & 0xc;
      k = uVar4;
    } while (uVar2 == 0);
    uVar4 = uVar4 & 1;
    if (uVar4 != 0) {
      if ((int)uVar1 < 0x81) {
        return 1;
      }
      do {
        uVar2 = (uint)uVar3;
        cftmdl1(uVar2,a + (int)(j - uVar2),w + (nw - (int)(uVar3 >> 1)));
        uVar1 = uVar1 >> 2;
        uVar3 = (ulong)uVar1;
      } while (0x203 < uVar2);
      return uVar4;
    }
    if ((int)uVar1 < 0x81) {
      return 0;
    }
    do {
      uVar2 = (uint)uVar3;
      cftmdl2(uVar2,a + (int)(j - uVar2),w + (int)(nw - uVar2));
      uVar1 = uVar1 >> 2;
      uVar3 = (ulong)uVar1;
    } while (0x203 < uVar2);
  }
  else {
    if ((k & 1U) != 0) {
      cftmdl1(n,a + (j - n),w + (nw - (n >> 1)));
      return 1;
    }
    cftmdl2(n,a + (j - n),w + (nw - n));
  }
  return 0;
}

Assistant:

int cfttree(int n, int j, int k, double *a, int nw, double *w) {
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
  int i, isplt, m;

  if ((k & 3) != 0) {
    isplt = k & 1;
    if (isplt != 0) {
      cftmdl1(n, &a[j - n], &w[nw - (n >> 1)]);
    } else {
      cftmdl2(n, &a[j - n], &w[nw - n]);
    }
  } else {
    m = n;
    for (i = k; (i & 3) == 0; i >>= 2) {
      m <<= 2;
    }
    isplt = i & 1;
    if (isplt != 0) {
      while (m > 128) {
        cftmdl1(m, &a[j - m], &w[nw - (m >> 1)]);
        m >>= 2;
      }
    } else {
      while (m > 128) {
        cftmdl2(m, &a[j - m], &w[nw - m]);
        m >>= 2;
      }
    }
  }
  return isplt;
}